

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSort.cpp
# Opt level: O2

void maxHeapsort(double *heap_v,HighsInt *heap_i,HighsInt n)

{
  double dVar1;
  HighsInt HVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(uint)n;
  while (1 < (int)uVar3) {
    dVar1 = heap_v[uVar3];
    heap_v[uVar3] = heap_v[1];
    heap_v[1] = dVar1;
    HVar2 = heap_i[uVar3];
    heap_i[uVar3] = heap_i[1];
    heap_i[1] = HVar2;
    uVar3 = uVar3 - 1;
    maxHeapify(heap_v,heap_i,1,(HighsInt)uVar3);
  }
  return;
}

Assistant:

void maxHeapsort(double* heap_v, HighsInt* heap_i, HighsInt n) {
  double temp_v;
  HighsInt i, temp_i;
  for (i = n; i >= 2; i--) {
    temp_v = heap_v[i];
    heap_v[i] = heap_v[1];
    heap_v[1] = temp_v;
    temp_i = heap_i[i];
    heap_i[i] = heap_i[1];
    heap_i[1] = temp_i;
    maxHeapify(heap_v, heap_i, 1, i - 1);
  }
}